

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

bool __thiscall sai::ifstreambuf::FetchPage(ifstreambuf *this,uint32_t PageIndex,VirtualPage *Dest)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  pointer pVVar4;
  size_t sVar5;
  pointer this_00;
  reference pvVar6;
  uint32_t NearestTable;
  VirtualPage *Dest_local;
  uint32_t PageIndex_local;
  ifstreambuf *this_local;
  
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) != 0) {
    return false;
  }
  bVar1 = VirtualPage::IsTableIndex((ulong)PageIndex);
  if (bVar1) {
    if (PageIndex == this->TableCacheIndex) {
      if (Dest != (VirtualPage *)0x0) {
        pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                           (&this->TableCache);
        memcpy(Dest,pVVar4,0x1000);
      }
      return true;
    }
    std::istream::seekg((long)&this->FileIn,PageIndex << 0xc);
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->TableCache);
    std::istream::read((char *)&this->FileIn,(long)pVVar4);
    uVar3 = std::ios::fail();
    if ((uVar3 & 1) != 0) {
      return false;
    }
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->TableCache);
    VirtualPage::DecryptTable((VirtualPage *)&pVVar4->u8,PageIndex);
    this->TableCacheIndex = PageIndex;
    if (Dest != (VirtualPage *)0x0) {
      pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                         (&this->TableCache);
      memcpy(Dest,pVVar4,0x1000);
    }
  }
  else {
    if (PageIndex == this->PageCacheIndex) {
      if (Dest != (VirtualPage *)0x0) {
        pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                           (&this->PageCache);
        memcpy(Dest,pVVar4,0x1000);
      }
      return true;
    }
    sVar5 = VirtualPage::NearestTableIndex((ulong)PageIndex);
    bVar1 = FetchPage(this,(uint32_t)sVar5,(VirtualPage *)0x0);
    if (!bVar1) {
      return false;
    }
    std::istream::seekg((long)&this->FileIn,PageIndex << 0xc);
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->PageCache);
    std::istream::read((char *)&this->FileIn,(long)pVVar4);
    uVar3 = std::ios::fail();
    if ((uVar3 & 1) != 0) {
      return false;
    }
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->PageCache);
    this_00 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                        (&this->TableCache);
    pvVar6 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                       (&this_00->PageEntries,(ulong)PageIndex & 0x1ff);
    VirtualPage::DecryptData((VirtualPage *)&pVVar4->u8,pvVar6->Checksum);
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->PageCache);
    uVar2 = VirtualPage::Checksum((VirtualPage *)&pVVar4->u8);
    pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                       (&this->TableCache);
    pvVar6 = std::array<sai::VirtualPage::PageEntry,_512UL>::operator[]
                       (&pVVar4->PageEntries,(ulong)PageIndex & 0x1ff);
    if (uVar2 != pvVar6->Checksum) {
      return false;
    }
    this->PageCacheIndex = PageIndex;
    if (Dest != (VirtualPage *)0x0) {
      pVVar4 = std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::get
                         (&this->PageCache);
      memcpy(Dest,pVVar4,0x1000);
    }
  }
  return true;
}

Assistant:

bool ifstreambuf::FetchPage(std::uint32_t PageIndex, VirtualPage* Dest)
{
	if( FileIn.fail() )
	{
		return false;
	}

	if( VirtualPage::IsTableIndex(PageIndex) ) // Table Block
	{
		if( PageIndex == TableCacheIndex )
		{
			// Cache Hit
			if( Dest != nullptr )
			{
				std::memcpy(Dest, TableCache.get(), VirtualPage::PageSize);
			}
			return true;
		}
		// Cache Miss
		// Get table cache
		FileIn.seekg(PageIndex * VirtualPage::PageSize, std::ios::beg);
		FileIn.read(reinterpret_cast<char*>(TableCache.get()), VirtualPage::PageSize);
		if( FileIn.fail() )
		{
			return false;
		}
		TableCache.get()->DecryptTable(PageIndex);
		TableCacheIndex = PageIndex;
		if( Dest != nullptr )
		{
			std::memcpy(Dest, TableCache.get(), VirtualPage::PageSize);
		}
	}
	else // Data Block
	{
		if( PageIndex == PageCacheIndex )
		{
			// Cache Hit
			if( Dest != nullptr )
			{
				std::memcpy(Dest, PageCache.get(), VirtualPage::PageSize);
			}
			return true;
		}
		// Prefetch nearest table
		// Ensure it is in the cache
		const std::uint32_t NearestTable = VirtualPage::NearestTableIndex(PageIndex);

		if( FetchPage(NearestTable, nullptr) == false )
		{
			// Failed to fetch table
			return false;
		}
		FileIn.seekg(PageIndex * VirtualPage::PageSize, std::ios::beg);
		FileIn.read(reinterpret_cast<char*>(PageCache.get()), VirtualPage::PageSize);
		if( FileIn.fail() )
		{
			return false;
		}
		PageCache.get()->DecryptData(
			TableCache.get()->PageEntries[PageIndex % VirtualPage::TableSpan].Checksum
		);

		if( PageCache.get()->Checksum()
			!= TableCache.get()->PageEntries[PageIndex % VirtualPage::TableSpan].Checksum )
		{
			// Checksum mismatch, file corrupt
			return false;
		}

		PageCacheIndex = PageIndex;
		if( Dest != nullptr )
		{
			std::memcpy(Dest, PageCache.get(), VirtualPage::PageSize);
		}
	}
	return true;
}